

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O3

void __thiscall SGParser::Generator::Grammar::Clear(Grammar *this)

{
  pointer puVar1;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           *)this);
  puVar1 = (this->GrammarSymbolList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->GrammarSymbolList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->GrammarSymbolList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  ClearProductions(this);
  this->ProductionCount = 0;
  puVar1 = (this->StartSymbols).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->StartSymbols).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->StartSymbols).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>,_std::_Select1st<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
  ::clear(&(this->Precedence)._M_t);
  GrammarDebugData::Clear(&this->DebugData);
  return;
}

Assistant:

void Grammar::Clear() {
    GrammarSymbols.clear();
    GrammarSymbolList.clear();
    ClearProductions();
    ProductionCount = 0u;
    StartSymbols.clear();
    Precedence.clear();
    DebugData.Clear();
}